

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O2

PSNode * __thiscall
dg::pta::LLVMPointerGraphBuilder::createInternalLoad
          (LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  Use *pUVar1;
  PSNode *pPVar2;
  PSNode *op1;
  PSNode *local_10;
  
  pUVar1 = llvm::User::getOperandList((User *)Inst);
  local_10 = getOperand(this,*(Value **)pUVar1);
  pPVar2 = PointerGraph::create<(dg::pta::PSNodeType)2,dg::pta::PSNode*&>
                     ((PointerGraph *)this,&local_10);
  return pPVar2;
}

Assistant:

PSNode *
LLVMPointerGraphBuilder::createInternalLoad(const llvm::Instruction *Inst) {
    const llvm::Value *op = Inst->getOperand(0);

    PSNode *op1 = getOperand(op);
    PSNode *node = PS.create<PSNodeType::LOAD>(op1);
    assert(node);

    return node;
}